

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::
ImmutablePrimitiveOneofFieldLiteGenerator
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  OneofDescriptor *oneof;
  
  ImmutablePrimitiveFieldLiteGenerator::ImmutablePrimitiveFieldLiteGenerator
            (&this->super_ImmutablePrimitiveFieldLiteGenerator,descriptor,messageBitIndex,context);
  (this->super_ImmutablePrimitiveFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__ImmutablePrimitiveOneofFieldLiteGenerator_00521590;
  if (((byte)descriptor[1] & 0x10) == 0) {
    oneof = (OneofDescriptor *)0x0;
  }
  else {
    oneof = *(OneofDescriptor **)(descriptor + 0x28);
    if (oneof == (OneofDescriptor *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                 ,0xa9a);
    }
  }
  info = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_);
  return;
}

Assistant:

ImmutablePrimitiveOneofFieldLiteGenerator::
    ImmutablePrimitiveOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                              int messageBitIndex,
                                              Context* context)
    : ImmutablePrimitiveFieldLiteGenerator(descriptor, messageBitIndex,
                                           context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}